

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::UpdateConversionPathTable(cmake *this)

{
  cmState *this_00;
  char *m2;
  string b;
  string a;
  ifstream table;
  string local_270;
  string local_250;
  string local_230;
  byte abStack_210 [488];
  
  this_00 = this->State;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"CMAKE_PATH_TRANSLATION_FILE","");
  m2 = cmState::GetInitializedCacheValue(this_00,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (m2 != (char *)0x0) {
    std::ifstream::ifstream(&local_230,m2,_S_in);
    if ((abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_250._M_string_length = 0;
      local_250.field_2._M_local_buf[0] = '\0';
      local_270._M_string_length = 0;
      local_270.field_2._M_local_buf[0] = '\0';
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      while ((abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 2) == 0) {
        std::operator>>((istream *)&local_230,(string *)&local_250);
        std::operator>>((istream *)&local_230,(string *)&local_270);
        cmsys::SystemTools::AddTranslationPath(&local_250,&local_270);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                 local_270.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                 local_250.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      cmSystemTools::Error
                ("CMAKE_PATH_TRANSLATION_FILE set to ",m2,". CMake can not open file.",(char *)0x0);
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    }
    std::ifstream::~ifstream(&local_230);
  }
  return;
}

Assistant:

void cmake::UpdateConversionPathTable()
{
  // Update the path conversion table with any specified file:
  const char* tablepath =
    this->State
        ->GetInitializedCacheValue("CMAKE_PATH_TRANSLATION_FILE");

  if(tablepath)
    {
    cmsys::ifstream table( tablepath );
    if(!table)
      {
      cmSystemTools::Error("CMAKE_PATH_TRANSLATION_FILE set to ", tablepath,
        ". CMake can not open file.");
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
      }
    else
      {
      std::string a, b;
      while(!table.eof())
        {
        // two entries per line
        table >> a; table >> b;
        cmSystemTools::AddTranslationPath( a, b);
        }
      }
    }
}